

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

int InitParams(uint8_t *data,int width,int height,int stride,int radius,SmoothParams *p)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  int *in_R9;
  uint8_t *mem;
  size_t total_size;
  size_t size_lut;
  size_t size_m;
  size_t size_scratch_m;
  int R;
  SmoothParams *in_stack_000000c0;
  uint local_4;
  
  iVar1 = in_R8D * 2 + 1;
  lVar2 = (long)((in_R8D * 2 + 2) * in_ESI) * 2;
  pvVar3 = WebPSafeMalloc(0xffe,lVar2 + (long)in_ESI * 2 + 0xffe);
  if (pvVar3 != (void *)0x0) {
    *(void **)(in_R9 + 10) = pvVar3;
    *(void **)(in_R9 + 0xc) = pvVar3;
    *(undefined8 *)(in_R9 + 0xe) = *(undefined8 *)(in_R9 + 0xc);
    *(long *)(in_R9 + 0x10) = *(long *)(in_R9 + 0xc) + (long)(iVar1 * in_ESI) * 2;
    *(long *)(in_R9 + 0x12) = *(long *)(in_R9 + 0x10) + (long)in_ESI * -2;
    memset(*(void **)(in_R9 + 0x12),0,(long)in_ESI << 1);
    pvVar4 = (void *)(lVar2 + (long)pvVar3);
    *(void **)(in_R9 + 0x14) = pvVar4;
    *in_R9 = in_ESI;
    in_R9[1] = in_EDX;
    in_R9[2] = in_ECX;
    *(undefined8 *)(in_R9 + 4) = in_RDI;
    *(undefined8 *)(in_R9 + 6) = in_RDI;
    in_R9[8] = in_R8D;
    in_R9[9] = (int)(0x40000 / (long)(iVar1 * iVar1));
    in_R9[3] = -in_R8D;
    CountLevels(in_stack_000000c0);
    *(long *)(in_R9 + 0x1a) = (long)pvVar4 + (long)in_ESI * 2 + 0x7fe;
    InitCorrectionLUT(*(int16_t **)(in_R9 + 0x1a),in_R9[0x19]);
  }
  local_4 = (uint)(pvVar3 != (void *)0x0);
  return local_4;
}

Assistant:

static int InitParams(uint8_t* const data, int width, int height, int stride,
                      int radius, SmoothParams* const p) {
  const int R = 2 * radius + 1;  // total size of the kernel

  const size_t size_scratch_m = (R + 1) * width * sizeof(*p->start);
  const size_t size_m =  width * sizeof(*p->average);
  const size_t size_lut = (1 + 2 * LUT_SIZE) * sizeof(*p->correction);
  const size_t total_size = size_scratch_m + size_m + size_lut;
  uint8_t* mem = (uint8_t*)WebPSafeMalloc(1U, total_size);

  if (mem == NULL) return 0;
  p->mem = (void*)mem;

  p->start = (uint16_t*)mem;
  p->cur = p->start;
  p->end = p->start + R * width;
  p->top = p->end - width;
  memset(p->top, 0, width * sizeof(*p->top));
  mem += size_scratch_m;

  p->average = (uint16_t*)mem;
  mem += size_m;

  p->width = width;
  p->height = height;
  p->stride = stride;
  p->src = data;
  p->dst = data;
  p->radius = radius;
  p->scale = (1 << (FIX + LFIX)) / (R * R);  // normalization constant
  p->row = -radius;

  // analyze the input distribution so we can best-fit the threshold
  CountLevels(p);

  // correction table
  p->correction = ((int16_t*)mem) + LUT_SIZE;
  InitCorrectionLUT(p->correction, p->min_level_dist);

  return 1;
}